

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLuint gl4cts::CopyImage::Utils::prepareTex16x16x6
                 (Context *context,GLenum target,GLenum internal_format,GLenum format,GLenum type,
                 GLuint *out_buf_id)

{
  GLuint name_00;
  GLuint name;
  GLuint *out_buf_id_local;
  GLenum type_local;
  GLenum format_local;
  GLenum internal_format_local;
  GLenum target_local;
  Context *context_local;
  
  name_00 = generateTexture(context,target);
  prepareTexture(context,name_00,target,internal_format,format,type,0,0x10,0x10,6,
                 prepareTex16x16x6::pixels,out_buf_id);
  return name_00;
}

Assistant:

GLuint Utils::prepareTex16x16x6(deqp::Context& context, GLenum target, GLenum internal_format, GLenum format,
								GLenum type, GLuint& out_buf_id)
{
	static const GLuint  depth  = 6;
	static const GLuint  height = 16;
	static const GLuint  level  = 0;
	GLuint				 name   = 0;
	static const GLchar* pixels = 0;
	static const GLuint  width  = 16;

	name = generateTexture(context, target);

	prepareTexture(context, name, target, internal_format, format, type, level, width, height, depth, pixels,
				   out_buf_id);

	return name;
}